

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valve.cpp
# Opt level: O3

void __thiscall Valve::findGpvHeadLoss(Valve *this,Network *nw,double q)

{
  Curve *this_00;
  ulong in_XMM0_Qb;
  double dVar1;
  double local_68;
  double local_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  ulong uStack_30;
  double local_28;
  
  local_38 = q;
  uStack_30 = in_XMM0_Qb;
  this_00 = Network::curve(nw,(int)(this->super_Link).setting);
  local_28 = (nw->units).factors[1];
  local_48 = (nw->units).factors[5];
  uStack_40 = 0;
  local_58 = ABS(local_38);
  uStack_50 = uStack_30 & 0x7fffffffffffffff;
  Curve::findSegment(this_00,local_58 * local_48,&local_68,&local_60);
  local_68 = (local_48 / local_28) * local_68;
  (this->super_Link).hGrad = local_68;
  dVar1 = local_68 * local_58 + local_60 / local_28;
  (this->super_Link).hLoss =
       (double)(-(ulong)(local_38 < 0.0) & (ulong)-dVar1 | ~-(ulong)(local_38 < 0.0) & (ulong)dVar1)
  ;
  return;
}

Assistant:

void Valve::findGpvHeadLoss(Network* nw, double q)
{
    // ... retrieve head loss curve for valve

    int curveIndex = (int)setting;
    Curve* curve = nw->curve(curveIndex);

    // ... retrieve units conversion factors (curve is in user's units)

    double ucfFlow = nw->ucf(Units::FLOW);
    double ucfHead = nw->ucf(Units::LENGTH);

    // ... find slope (r) and intercept (h0) of curve segment

    double qRaw = abs(q) * ucfFlow;
    double r, h0;
    curve->findSegment(qRaw, r, h0);

    // ... convert to internal units

    r *= ucfFlow / ucfHead;
    h0 /= ucfHead;

    // ... determine head loss and derivative for this curve segment

    hGrad = r; //+ 2.0 * lossFactor * abs(q);
    hLoss = h0 + r * abs(q); // + lossFactor * q * q;
    if ( q < 0.0 ) hLoss = -hLoss;
}